

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtrclient.c
# Opt level: O3

void print_templates(void)

{
  long lVar1;
  int iVar2;
  char *__s;
  pfx_output_template *ppVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __s = "default";
  ppVar3 = templates;
  do {
    ppVar3 = ppVar3 + 1;
    if (template_name == (char *)0x0) {
      puts(__s);
    }
    else {
      iVar2 = strcmp(__s,template_name);
      if (iVar2 == 0) {
        printf("%s",ppVar3[-1].template);
      }
    }
    __s = ppVar3->name;
  } while (__s != (char *)0x0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void print_templates(void)
{
	const struct pfx_output_template *current = templates;

	while (current->name) {
		if (template_name && strcmp(current->name, template_name) == 0)
			printf("%s", current->template);
		else if (!template_name)
			printf("%s\n", current->name);

		++current;
	}
}